

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:266:36)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:266:36)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  long *plVar2;
  
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish) || (pvVar1->type_ < boolean)) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    global_object::make_object((global_object *)&stack0xffffffffffffffe0);
    value::value(__return_storage_ptr__,(object_ptr *)&stack0xffffffffffffffe0);
  }
  else {
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    (**(code **)(*plVar2 + 0x88))
              ((object_ptr *)&stack0xffffffffffffffe0,plVar2,
               (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start);
    value::value(__return_storage_ptr__,(object_ptr *)&stack0xffffffffffffffe0);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }